

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_set_exif(LodePNGInfo *info,uchar *exif,uint exif_size)

{
  void *pvVar1;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x88) != 0) {
    lodepng_clear_exif((LodePNGInfo *)0x347e1a);
  }
  pvVar1 = lodepng_malloc(0x347e25);
  *(void **)(in_RDI + 0x90) = pvVar1;
  if (*(long *)(in_RDI + 0x90) == 0) {
    local_4 = 0x53;
  }
  else {
    lodepng_memcpy(*(void **)(in_RDI + 0x90),in_RSI,(ulong)in_EDX);
    *(uint *)(in_RDI + 0x98) = in_EDX;
    *(undefined4 *)(in_RDI + 0x88) = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned lodepng_set_exif(LodePNGInfo* info, const unsigned char* exif, unsigned exif_size) {
  if(info->exif_defined) lodepng_clear_exif(info);
  info->exif = (unsigned char*)lodepng_malloc(exif_size);

  if(!info->exif) return 83; /*alloc fail*/

  lodepng_memcpy(info->exif, exif, exif_size);
  info->exif_size = exif_size;
  info->exif_defined = 1;

  return 0; /*ok*/
}